

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

int in_permitted_area_end_bit(tgestate_t *state,uint8_t room_and_flags)

{
  int iVar1;
  
  if ((char)room_and_flags < '\0') {
    return (int)(state->room_index == (room_and_flags & 0x7f));
  }
  if (state->room_index != 0) {
    return 0;
  }
  iVar1 = within_camp_bounds(room_and_flags,&state->hero_mappos);
  return iVar1;
}

Assistant:

int in_permitted_area_end_bit(tgestate_t *state, uint8_t room_and_flags)
{
  room_t room; /* was HL */

  assert(state != NULL);

  room = state->room_index; /* Conv: Dereferenced up-front once. */

  if (room_and_flags & permitted_route_ROOM)
  {
    /* Hero should be in the specified room. */
    ASSERT_ROOM_VALID(room_and_flags & ~permitted_route_ROOM);
    return room == (room_and_flags & ~permitted_route_ROOM);
  }
  else if (room == room_0_OUTDOORS) // is outside
  {
    /* Hero is outdoors - check bounds. */
    return within_camp_bounds(room_and_flags, &state->hero_mappos);
  }
  else
  {
    /* Hero should be outside but is in room - not permitted. */
    return 0;
  }
}